

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v6::internal::bigint::multiply(bigint *this,uint64_t value)

{
  size_t sVar1;
  uint *puVar2;
  ulong uVar3;
  ulong in_RSI;
  buffer<unsigned_int> *in_RDI;
  double_bigit result;
  size_t n;
  size_t i;
  double_bigit carry;
  double_bigit upper;
  double_bigit lower;
  bigit mask;
  uint *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  undefined8 local_38;
  undefined8 local_30;
  
  local_30 = 0;
  local_38 = 0;
  sVar1 = buffer<unsigned_int>::size(in_RDI);
  for (; local_38 < sVar1; local_38 = local_38 + 1) {
    puVar2 = buffer<unsigned_int>::operator[](in_RDI,local_38);
    uVar3 = (ulong)*puVar2 * (in_RSI & 0xffffffff) + (local_30 & 0xffffffff);
    puVar2 = buffer<unsigned_int>::operator[](in_RDI,local_38);
    local_30 = (ulong)*puVar2 * (in_RSI >> 0x20) + (uVar3 >> 0x20) + (local_30 >> 0x20);
    in_stack_ffffffffffffffa4 = (uint)uVar3;
    puVar2 = buffer<unsigned_int>::operator[](in_RDI,local_38);
    *puVar2 = in_stack_ffffffffffffffa4;
  }
  for (; local_30 != 0; local_30 = local_30 >> 0x20) {
    buffer<unsigned_int>::push_back
              ((buffer<unsigned_int> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
               ,in_stack_ffffffffffffff98);
  }
  return;
}

Assistant:

void multiply(uint64_t value) {
    const bigit mask = ~bigit(0);
    const double_bigit lower = value & mask;
    const double_bigit upper = value >> bigit_bits;
    double_bigit carry = 0;
    for (size_t i = 0, n = bigits_.size(); i < n; ++i) {
      double_bigit result = bigits_[i] * lower + (carry & mask);
      carry =
          bigits_[i] * upper + (result >> bigit_bits) + (carry >> bigit_bits);
      bigits_[i] = static_cast<bigit>(result);
    }
    while (carry != 0) {
      bigits_.push_back(carry & mask);
      carry >>= bigit_bits;
    }
  }